

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86IntelInstPrinter.c
# Opt level: O1

void get_op_access(cs_struct *h,uint id,uint8_t *access,uint64_t *eflags)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t *puVar3;
  uint8_t uVar4;
  
  puVar1 = X86_get_op_access(h,id,eflags);
  puVar3 = access;
  if (puVar1 == (uint8_t *)0x0) {
LAB_0022f078:
    *puVar3 = '\0';
    return;
  }
  bVar2 = 0;
  do {
    uVar4 = puVar1[bVar2];
    puVar3 = access + bVar2;
    if (uVar4 == 0x80) {
      uVar4 = '\0';
    }
    else if (uVar4 == '\0') goto LAB_0022f078;
    *puVar3 = uVar4;
    bVar2 = bVar2 + 1;
  } while( true );
}

Assistant:

static void get_op_access(cs_struct *h, unsigned int id, uint8_t *access, uint64_t *eflags)
{
#ifndef CAPSTONE_DIET
	uint8_t i;
	uint8_t *arr = X86_get_op_access(h, id, eflags);

	if (!arr) {
		access[0] = 0;
		return;
	}

	// copy to access but zero out CS_AC_IGNORE
	for(i = 0; arr[i]; i++) {
		if (arr[i] != CS_AC_IGNORE)
			access[i] = arr[i];
		else
			access[i] = 0;
	}

	// mark the end of array
	access[i] = 0;
#endif
}